

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFFormValue.cpp
# Opt level: O0

bool __thiscall
llvm::DWARFFormValue::extractValue
          (DWARFFormValue *this,DWARFDataExtractor *Data,uint64_t *OffsetPtr,FormParams FP,
          DWARFContext *Ctx,DWARFUnit *CU)

{
  byte bVar1;
  bool bVar2;
  uint16_t uVar3;
  uint uVar4;
  uint32_t uVar5;
  int64_t iVar6;
  char *pcVar7;
  uint64_t uVar8;
  uchar *puVar9;
  anon_union_8_3_82d75f4a_for_ValueType_0 aVar10;
  anon_union_8_3_82d75f4a_for_ValueType_0 aVar11;
  anon_union_8_3_82d75f4a_for_ValueType_0 aVar12;
  anon_union_8_3_82d75f4a_for_ValueType_0 aVar13;
  anon_union_8_3_82d75f4a_for_ValueType_0 aVar14;
  anon_union_8_3_82d75f4a_for_ValueType_0 aVar15;
  byte local_6d;
  StringRef local_60;
  undefined1 local_50 [8];
  StringRef Str;
  uint16_t Size;
  bool IsBlock;
  bool Indirect;
  DWARFUnit *CU_local;
  DWARFContext *Ctx_local;
  uint64_t *OffsetPtr_local;
  DWARFDataExtractor *Data_local;
  DWARFFormValue *this_local;
  FormParams FP_local;
  
  CU_local = (DWARFUnit *)Ctx;
  this_local._4_4_ = FP;
  if ((Ctx == (DWARFContext *)0x0) && (CU != (DWARFUnit *)0x0)) {
    CU_local = (DWARFUnit *)DWARFUnit::getContext(CU);
  }
  this->C = (DWARFContext *)CU_local;
  this->U = CU;
  Str.Length._6_1_ = 0;
  (this->Value).data = (uint8_t *)0x0;
  do {
    Str.Length._7_1_ = 0;
    uVar4 = (uint)this->Form;
    if (uVar4 == 1) {
LAB_02824c14:
      if (this->Form == DW_FORM_addr) {
        local_6d = this_local._6_1_;
      }
      else {
        local_6d = dwarf::FormParams::getRefAddrByteSize((FormParams *)((long)&this_local + 4));
      }
      Str.Length._4_2_ = (ushort)local_6d;
      uVar8 = DWARFDataExtractor::getRelocatedValue
                        (Data,(uint)Str.Length._4_2_,OffsetPtr,&(this->Value).SectionIndex,
                         (Error *)0x0);
      (this->Value).field_0.uval = uVar8;
    }
    else if (uVar4 == 3) {
      uVar3 = DataExtractor::getU16(&Data->super_DataExtractor,OffsetPtr,(Error *)0x0);
      aVar11.uval._2_6_ = 0;
      aVar11.uval._0_2_ = uVar3;
      (this->Value).field_0 = aVar11;
      Str.Length._6_1_ = 1;
    }
    else if (uVar4 == 4) {
      uVar5 = DataExtractor::getU32(&Data->super_DataExtractor,OffsetPtr,(Error *)0x0);
      aVar12.uval._4_4_ = 0;
      aVar12.uval._0_4_ = uVar5;
      (this->Value).field_0 = aVar12;
      Str.Length._6_1_ = 1;
    }
    else {
      if (uVar4 == 5) goto LAB_02824d2d;
      if (uVar4 == 6) goto LAB_02824d6f;
      if (uVar4 == 7) {
LAB_02824d99:
        uVar8 = DWARFDataExtractor::getRelocatedValue(Data,8,OffsetPtr,(uint64_t *)0x0,(Error *)0x0)
        ;
        (this->Value).field_0.uval = uVar8;
      }
      else if (uVar4 == 8) {
        pcVar7 = DataExtractor::getCStr(&Data->super_DataExtractor,OffsetPtr);
        (this->Value).field_0.cstr = pcVar7;
      }
      else if (uVar4 == 9) {
LAB_02824c70:
        uVar8 = DataExtractor::getULEB128(&Data->super_DataExtractor,OffsetPtr,(Error *)0x0);
        (this->Value).field_0.uval = uVar8;
        Str.Length._6_1_ = 1;
      }
      else if (uVar4 == 10) {
        bVar1 = DataExtractor::getU8(&Data->super_DataExtractor,OffsetPtr,(Error *)0x0);
        aVar10.uval._1_7_ = 0;
        aVar10.uval._0_1_ = bVar1;
        (this->Value).field_0 = aVar10;
        Str.Length._6_1_ = 1;
      }
      else {
        if (uVar4 - 0xb < 2) goto LAB_02824d0a;
        if (uVar4 == 0xd) {
          iVar6 = DataExtractor::getSLEB128(&Data->super_DataExtractor,OffsetPtr);
          (this->Value).field_0.sval = iVar6;
        }
        else {
          if (uVar4 == 0xe) goto LAB_02824e57;
          if (uVar4 == 0xf) {
LAB_02824df5:
            uVar8 = DataExtractor::getULEB128(&Data->super_DataExtractor,OffsetPtr,(Error *)0x0);
            (this->Value).field_0.uval = uVar8;
          }
          else {
            if (uVar4 == 0x10) goto LAB_02824c14;
            if (uVar4 == 0x11) goto LAB_02824d0a;
            if (uVar4 == 0x12) goto LAB_02824d2d;
            if (uVar4 == 0x13) goto LAB_02824d6f;
            if (uVar4 == 0x14) goto LAB_02824d99;
            if (uVar4 == 0x15) goto LAB_02824df5;
            if (uVar4 == 0x16) {
              uVar8 = DataExtractor::getULEB128(&Data->super_DataExtractor,OffsetPtr,(Error *)0x0);
              this->Form = (Form)uVar8;
              Str.Length._7_1_ = 1;
              goto LAB_02824eef;
            }
            if (uVar4 == 0x17) goto LAB_02824e57;
            if (uVar4 == 0x18) goto LAB_02824c70;
            if (uVar4 == 0x19) {
              (this->Value).field_0.uval = 1;
            }
            else if (uVar4 - 0x1a < 2) {
LAB_02824eb9:
              uVar8 = DataExtractor::getULEB128(&Data->super_DataExtractor,OffsetPtr,(Error *)0x0);
              (this->Value).field_0.uval = uVar8;
            }
            else {
              if (uVar4 == 0x1c) goto LAB_02824d6f;
              if (uVar4 == 0x1d) {
LAB_02824e57:
                bVar1 = dwarf::FormParams::getDwarfOffsetByteSize
                                  ((FormParams *)((long)&this_local + 4));
                uVar8 = DWARFDataExtractor::getRelocatedValue
                                  (Data,(uint)bVar1,OffsetPtr,(uint64_t *)0x0,(Error *)0x0);
                (this->Value).field_0.uval = uVar8;
              }
              else if (uVar4 == 0x1e) {
                (this->Value).field_0.uval = 0x10;
                Str.Length._6_1_ = 1;
              }
              else {
                if (uVar4 == 0x1f) goto LAB_02824e57;
                if (uVar4 == 0x20) {
                  uVar8 = DataExtractor::getU64(&Data->super_DataExtractor,OffsetPtr,(Error *)0x0);
                  (this->Value).field_0.uval = uVar8;
                }
                else {
                  if (uVar4 == 0x23) goto LAB_02824df5;
                  if (uVar4 == 0x24) goto LAB_02824d99;
                  if (uVar4 == 0x25) {
LAB_02824d0a:
                    bVar1 = DataExtractor::getU8(&Data->super_DataExtractor,OffsetPtr,(Error *)0x0);
                    aVar13.uval._1_7_ = 0;
                    aVar13.uval._0_1_ = bVar1;
                    (this->Value).field_0 = aVar13;
                  }
                  else if (uVar4 == 0x26) {
LAB_02824d2d:
                    uVar3 = DataExtractor::getU16(&Data->super_DataExtractor,OffsetPtr,(Error *)0x0)
                    ;
                    aVar14.uval._2_6_ = 0;
                    aVar14.uval._0_2_ = uVar3;
                    (this->Value).field_0 = aVar14;
                  }
                  else {
                    if (uVar4 == 0x27) {
                      uVar5 = DataExtractor::getU24(&Data->super_DataExtractor,OffsetPtr);
                      aVar15.uval._4_4_ = 0;
                      aVar15.uval._0_4_ = uVar5;
                      (this->Value).field_0 = aVar15;
                      goto LAB_02824eef;
                    }
                    if (uVar4 != 0x28) {
                      if (uVar4 == 0x29) goto LAB_02824d0a;
                      if (uVar4 == 0x2a) goto LAB_02824d2d;
                      if (uVar4 != 0x2c) {
                        if (uVar4 - 0x1f01 < 2) goto LAB_02824eb9;
                        if (1 < uVar4 - 0x1f20) {
                          llvm_unreachable_internal
                                    ("unsupported form",
                                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFFormValue.cpp"
                                     ,0x15d);
                        }
                        goto LAB_02824e57;
                      }
                    }
LAB_02824d6f:
                    uVar8 = DWARFDataExtractor::getRelocatedValue
                                      (Data,4,OffsetPtr,(uint64_t *)0x0,(Error *)0x0);
                    (this->Value).field_0.uval = uVar8;
                  }
                }
              }
            }
          }
        }
      }
    }
LAB_02824eef:
    if ((Str.Length._7_1_ & 1) == 0) {
      if ((Str.Length._6_1_ & 1) != 0) {
        local_60 = DataExtractor::getData(&Data->super_DataExtractor);
        _local_50 = StringRef::substr(&local_60,*OffsetPtr,(this->Value).field_0.uval);
        (this->Value).data = (uint8_t *)0x0;
        bVar2 = StringRef::empty((StringRef *)local_50);
        if (!bVar2) {
          puVar9 = StringRef::bytes_begin((StringRef *)local_50);
          (this->Value).data = puVar9;
          *OffsetPtr = (uint64_t)((this->Value).field_0.cstr + *OffsetPtr);
        }
      }
      return true;
    }
  } while( true );
}

Assistant:

bool DWARFFormValue::extractValue(const DWARFDataExtractor &Data,
                                  uint64_t *OffsetPtr, dwarf::FormParams FP,
                                  const DWARFContext *Ctx,
                                  const DWARFUnit *CU) {
  if (!Ctx && CU)
    Ctx = &CU->getContext();
  C = Ctx;
  U = CU;
  bool Indirect = false;
  bool IsBlock = false;
  Value.data = nullptr;
  // Read the value for the form into value and follow and DW_FORM_indirect
  // instances we run into
  do {
    Indirect = false;
    switch (Form) {
    case DW_FORM_addr:
    case DW_FORM_ref_addr: {
      uint16_t Size =
          (Form == DW_FORM_addr) ? FP.AddrSize : FP.getRefAddrByteSize();
      Value.uval = Data.getRelocatedValue(Size, OffsetPtr, &Value.SectionIndex);
      break;
    }
    case DW_FORM_exprloc:
    case DW_FORM_block:
      Value.uval = Data.getULEB128(OffsetPtr);
      IsBlock = true;
      break;
    case DW_FORM_block1:
      Value.uval = Data.getU8(OffsetPtr);
      IsBlock = true;
      break;
    case DW_FORM_block2:
      Value.uval = Data.getU16(OffsetPtr);
      IsBlock = true;
      break;
    case DW_FORM_block4:
      Value.uval = Data.getU32(OffsetPtr);
      IsBlock = true;
      break;
    case DW_FORM_data1:
    case DW_FORM_ref1:
    case DW_FORM_flag:
    case DW_FORM_strx1:
    case DW_FORM_addrx1:
      Value.uval = Data.getU8(OffsetPtr);
      break;
    case DW_FORM_data2:
    case DW_FORM_ref2:
    case DW_FORM_strx2:
    case DW_FORM_addrx2:
      Value.uval = Data.getU16(OffsetPtr);
      break;
    case DW_FORM_strx3:
      Value.uval = Data.getU24(OffsetPtr);
      break;
    case DW_FORM_data4:
    case DW_FORM_ref4:
    case DW_FORM_ref_sup4:
    case DW_FORM_strx4:
    case DW_FORM_addrx4:
      Value.uval = Data.getRelocatedValue(4, OffsetPtr);
      break;
    case DW_FORM_data8:
    case DW_FORM_ref8:
    case DW_FORM_ref_sup8:
      Value.uval = Data.getRelocatedValue(8, OffsetPtr);
      break;
    case DW_FORM_data16:
      // Treat this like a 16-byte block.
      Value.uval = 16;
      IsBlock = true;
      break;
    case DW_FORM_sdata:
      Value.sval = Data.getSLEB128(OffsetPtr);
      break;
    case DW_FORM_udata:
    case DW_FORM_ref_udata:
    case DW_FORM_rnglistx:
      Value.uval = Data.getULEB128(OffsetPtr);
      break;
    case DW_FORM_string:
      Value.cstr = Data.getCStr(OffsetPtr);
      break;
    case DW_FORM_indirect:
      Form = static_cast<dwarf::Form>(Data.getULEB128(OffsetPtr));
      Indirect = true;
      break;
    case DW_FORM_strp:
    case DW_FORM_sec_offset:
    case DW_FORM_GNU_ref_alt:
    case DW_FORM_GNU_strp_alt:
    case DW_FORM_line_strp:
    case DW_FORM_strp_sup: {
      Value.uval =
          Data.getRelocatedValue(FP.getDwarfOffsetByteSize(), OffsetPtr);
      break;
    }
    case DW_FORM_flag_present:
      Value.uval = 1;
      break;
    case DW_FORM_ref_sig8:
      Value.uval = Data.getU64(OffsetPtr);
      break;
    case DW_FORM_GNU_addr_index:
    case DW_FORM_GNU_str_index:
    case DW_FORM_addrx:
    case DW_FORM_strx:
      Value.uval = Data.getULEB128(OffsetPtr);
      break;
    default:
      // DWARFFormValue::skipValue() will have caught this and caused all
      // DWARF DIEs to fail to be parsed, so this code is not be reachable.
      llvm_unreachable("unsupported form");
    }
  } while (Indirect);

  if (IsBlock) {
    StringRef Str = Data.getData().substr(*OffsetPtr, Value.uval);
    Value.data = nullptr;
    if (!Str.empty()) {
      Value.data = Str.bytes_begin();
      *OffsetPtr += Value.uval;
    }
  }

  return true;
}